

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.h
# Opt level: O2

void __thiscall embree::Averaged<double>::add(Averaged<double> *this,double v)

{
  size_type sVar1;
  pair<double,_double> local_18;
  
  local_18.first = getSeconds();
  local_18.second = v;
  std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_front<std::pair<double,double>>
            ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)this,
             &local_18);
  sVar1 = std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                    (&this->values);
  if (this->N < sVar1) {
    std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::resize
              (&this->values,this->N);
  }
  return;
}

Assistant:

void add(double v)
    {
      values.push_front(std::make_pair(getSeconds(),v));
      if (values.size() > N) values.resize(N);
    }